

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

bool mjs::anon_unknown_33::check_for_immutability(object_ptr *o,property_attribute attr)

{
  bool bVar1;
  property_attribute attributes;
  void *pvVar2;
  object *this;
  long *plVar3;
  string *p;
  bool bVar4;
  wstring_view local_58;
  vector<mjs::string,_std::allocator<mjs::string>_> local_48;
  
  pvVar2 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  if (*(char *)((long)pvVar2 + 0x1c) == '\0') {
    this = (object *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    object::own_property_names(&local_48,this,false);
    do {
      bVar4 = local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar4) break;
      plVar3 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      local_58 = string::view(local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      attributes = (**(code **)(*plVar3 + 0x30))(plVar3,&local_58);
      bVar1 = has_attributes(attributes,attr);
      local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    } while (bVar1);
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_48);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool check_for_immutability(const object_ptr& o, property_attribute attr) {
    if (o->is_extensible()) {
        return false;
    }
    for (const auto& p : o->own_property_names(false)) {
        if (!has_attributes(o->own_property_attributes(p.view()), attr)) {
            return false;
        }
    }
    return true;
}